

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XNA_Song.c
# Opt level: O1

void XNA_SongKill(void)

{
  if (songVoice != (FAudioSourceVoice *)0x0) {
    FAudioSourceVoice_Stop(songVoice,0,0);
    FAudioVoice_DestroyVoice(songVoice);
    songVoice = (FAudioSourceVoice *)0x0;
  }
  if (songCache != (uint8_t *)0x0) {
    SDL_free();
    songCache = (uint8_t *)0x0;
  }
  if (activeSong != (stb_vorbis *)0x0) {
    stb_vorbis_close(activeSong);
    activeSong = (stb_vorbis *)0x0;
  }
  return;
}

Assistant:

static void XNA_SongKill()
{
	if (songVoice != NULL)
	{
		FAudioSourceVoice_Stop(songVoice, 0, 0);
		FAudioVoice_DestroyVoice(songVoice);
		songVoice = NULL;
	}
	if (songCache != NULL)
	{
		FAudio_free(songCache);
		songCache = NULL;
	}
	if (activeSong != NULL)
	{
		stb_vorbis_close(activeSong);
		activeSong = NULL;
	}
}